

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O2

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::process_validateTrace
          (AggregationValidatorProcessor *this,int32_t seqid,TProtocol *iprot,TProtocol *oprot,
          void *callContext)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined4 uVar3;
  ulong __n;
  TProtocol *extraout_RDX;
  TProtocol *__buf;
  void *__buf_00;
  void *pvVar4;
  undefined1 auVar5 [16];
  allocator local_e8 [32];
  TApplicationException x;
  TProcessorContextFreer freer;
  AggregationValidator_validateTrace_result result;
  AggregationValidator_validateTrace_args args;
  
  __n = (ulong)(uint)seqid;
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    freer.handler_ = (element_type *)0x0;
    pvVar4 = (void *)0x0;
    __buf = iprot;
  }
  else {
    auVar5 = (**(code **)(*(long *)peVar1 + 0x10))
                       (peVar1,"AggregationValidator.validateTrace",callContext);
    pvVar4 = auVar5._0_8_;
    freer.handler_ =
         (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
         super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    __buf = auVar5._8_8_;
  }
  freer.method_ = "AggregationValidator.validateTrace";
  freer.context_ = pvVar4;
  if (freer.handler_ != (element_type *)0x0) {
    (**(code **)(*(long *)freer.handler_ + 0x20))
              (freer.handler_,pvVar4,"AggregationValidator.validateTrace");
    __buf = extraout_RDX;
  }
  args.traceId._M_dataplus._M_p = (pointer)&args.traceId.field_2;
  args._vptr_AggregationValidator_validateTrace_args =
       (_func_int **)&PTR__AggregationValidator_validateTrace_args_00299890;
  args.traceId._M_string_length = 0;
  args.traceId.field_2._M_local_buf[0] = '\0';
  AggregationValidator_validateTrace_args::read
            (&args,(int)iprot,__buf,(size_t)args.traceId._M_dataplus._M_p);
  (*iprot->_vptr_TProtocol[0x18])(iprot);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)&x,
             &(iprot->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  uVar3 = (**(code **)(*(long *)x.super_TException._0_8_ + 0x40))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x28))(peVar1,pvVar4,"AggregationValidator.validateTrace",uVar3);
  }
  result._vptr_AggregationValidator_validateTrace_result =
       (_func_int **)&PTR__AggregationValidator_validateTrace_result_002998b0;
  result.success._0_8_ = &PTR__ValidateTraceResponse_0029ae20;
  result.success.ok = false;
  result.success.traceCount = 0;
  result.__isset = (_AggregationValidator_validateTrace_result__isset)((byte)result.__isset & 0xfe);
  peVar2 = (this->iface_).
           super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (**(code **)(*(long *)peVar2 + 0x10))(peVar2,&result.success,&args.traceId);
  result.__isset = (_AggregationValidator_validateTrace_result__isset)((byte)result.__isset | 1);
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x30))(peVar1,pvVar4,"AggregationValidator.validateTrace");
  }
  std::__cxx11::string::string((string *)&x,"validateTrace",local_e8);
  (*oprot->_vptr_TProtocol[2])(oprot,&x,2);
  std::__cxx11::string::~string((string *)&x);
  AggregationValidator_validateTrace_result::write(&result,(int)oprot,__buf_00,__n);
  (*oprot->_vptr_TProtocol[3])(oprot);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)&x,
             &(oprot->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  uVar3 = (**(code **)(*(long *)x.super_TException._0_8_ + 0x50))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)&x,
             &(oprot->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (**(code **)(*(long *)x.super_TException._0_8_ + 0x58))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
  peVar1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x38))(peVar1,pvVar4,"AggregationValidator.validateTrace",uVar3);
  }
  AggregationValidator_validateTrace_result::~AggregationValidator_validateTrace_result(&result);
  AggregationValidator_validateTrace_args::~AggregationValidator_validateTrace_args(&args);
  apache::thrift::TProcessorContextFreer::~TProcessorContextFreer(&freer);
  return;
}

Assistant:

void AggregationValidatorProcessor::process_validateTrace(int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("AggregationValidator.validateTrace", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "AggregationValidator.validateTrace");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "AggregationValidator.validateTrace");
  }

  AggregationValidator_validateTrace_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "AggregationValidator.validateTrace", bytes);
  }

  AggregationValidator_validateTrace_result result;
  try {
    iface_->validateTrace(result.success, args.traceId);
    result.__isset.success = true;
  } catch (const std::exception& e) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "AggregationValidator.validateTrace");
    }

    ::apache::thrift::TApplicationException x(e.what());
    oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preWrite(ctx, "AggregationValidator.validateTrace");
  }

  oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_REPLY, seqid);
  result.write(oprot);
  oprot->writeMessageEnd();
  bytes = oprot->getTransport()->writeEnd();
  oprot->getTransport()->flush();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postWrite(ctx, "AggregationValidator.validateTrace", bytes);
  }
}